

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
* wasm::WATParser::fields<wasm::WATParser::ParseTypeDefsCtx>
            (Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
             *__return_storage_ptr__,ParseTypeDefsCtx *ctx)

{
  Lexer *this;
  bool *this_00;
  Name name;
  bool bVar1;
  bool *pbVar2;
  string_view expected;
  FieldT field_00;
  FieldT field_01;
  FieldT field_02;
  undefined1 auStack_118 [8];
  FieldsT res;
  string local_e0;
  undefined1 local_c0 [8];
  optional<wasm::Name> id;
  Result<wasm::Field> field;
  undefined1 local_60 [8];
  Result<wasm::Field> _val;
  
  res.second.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  res.second.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  res.first.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  res.first.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auStack_118 = (undefined1  [8])0x0;
  res.first.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this = &ctx->in;
  this_00 = &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Name>._M_engaged;
  _val.val.super__Variant_base<wasm::Field,_wasm::Err>.
  super__Move_assign_alias<wasm::Field,_wasm::Err>.super__Copy_assign_alias<wasm::Field,_wasm::Err>.
  super__Move_ctor_alias<wasm::Field,_wasm::Err>.super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
  super__Variant_storage_alias<wasm::Field,_wasm::Err>._32_8_ = __return_storage_ptr__;
  while ((ctx->in).pos != (ctx->in).buffer._M_len) {
    bVar1 = Lexer::peekRParen(this);
    if (bVar1) break;
    expected._M_str = "field";
    expected._M_len = 5;
    bVar1 = Lexer::takeSExprStart(this,expected);
    if (bVar1) {
      Lexer::takeID((optional<wasm::Name> *)local_c0,this);
      if (id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Name>._M_payload._8_1_ != '\0') {
        fieldtype<wasm::WATParser::ParseTypeDefsCtx>((Result<wasm::Field> *)this_00,ctx);
        std::__detail::__variant::_Copy_ctor_base<false,_wasm::Field,_wasm::Err>::_Copy_ctor_base
                  ((_Copy_ctor_base<false,_wasm::Field,_wasm::Err> *)local_60,
                   (_Copy_ctor_base<false,_wasm::Field,_wasm::Err> *)this_00);
        if (_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
            super__Move_assign_alias<wasm::Field,_wasm::Err>.
            super__Copy_assign_alias<wasm::Field,_wasm::Err>.
            super__Move_ctor_alias<wasm::Field,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
            super__Variant_storage_alias<wasm::Field,_wasm::Err>._M_u._24_1_ == '\x01') {
          std::__cxx11::string::string
                    ((string *)
                     ((long)&field.val.super__Variant_base<wasm::Field,_wasm::Err>.
                             super__Move_assign_alias<wasm::Field,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Field,_wasm::Err> + 0x20),
                     (string *)local_60);
          std::__detail::__variant::
          _Variant_storage<false,std::pair<std::vector<wasm::Name,std::allocator<wasm::Name>>,std::vector<wasm::Field,std::allocator<wasm::Field>>>,wasm::Err>
          ::_Variant_storage<1ul,wasm::Err>
                    ((_Variant_storage<false,std::pair<std::vector<wasm::Name,std::allocator<wasm::Name>>,std::vector<wasm::Field,std::allocator<wasm::Field>>>,wasm::Err>
                      *)_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
                        super__Move_assign_alias<wasm::Field,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Field,_wasm::Err>._32_8_,
                     (__index_type *)
                     ((long)&field.val.super__Variant_base<wasm::Field,_wasm::Err>.
                             super__Move_assign_alias<wasm::Field,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Field,_wasm::Err> + 0x20));
          goto LAB_00c355c7;
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Field,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Field,_wasm::Err> *)local_60);
        bVar1 = Lexer::takeRParen(this);
        if (bVar1) {
          name.super_IString.str._M_str =
               (char *)id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.
                       str._M_len;
          name.super_IString.str._M_len = (size_t)local_c0;
          pbVar2 = (bool *)0x0;
          if (field.val.super__Variant_base<wasm::Field,_wasm::Err>.
              super__Move_assign_alias<wasm::Field,_wasm::Err>.
              super__Copy_assign_alias<wasm::Field,_wasm::Err>.
              super__Move_ctor_alias<wasm::Field,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
              super__Variant_storage_alias<wasm::Field,_wasm::Err>._M_u._24_1_ == '\0') {
            pbVar2 = this_00;
          }
          field_00._8_8_ = *(undefined8 *)(pbVar2 + 8);
          field_00.type.id =
               id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._16_8_;
          TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::appendField
                    (&ctx->super_TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>,
                     (FieldsT *)auStack_118,name,field_00);
          goto LAB_00c355a0;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,"expected end of field",
                   (allocator<char> *)
                   ((long)&field.val.super__Variant_base<wasm::Field,_wasm::Err>.
                           super__Move_assign_alias<wasm::Field,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Field,_wasm::Err> + 0x20));
        Lexer::err((Err *)local_60,this,&local_e0);
        std::__detail::__variant::
        _Variant_storage<false,std::pair<std::vector<wasm::Name,std::allocator<wasm::Name>>,std::vector<wasm::Field,std::allocator<wasm::Field>>>,wasm::Err>
        ::_Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,std::pair<std::vector<wasm::Name,std::allocator<wasm::Name>>,std::vector<wasm::Field,std::allocator<wasm::Field>>>,wasm::Err>
                    *)_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
                      super__Move_assign_alias<wasm::Field,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Field,_wasm::Err>._32_8_,local_60);
        std::__cxx11::string::~string((string *)local_60);
        std::__cxx11::string::~string((string *)&local_e0);
        goto LAB_00c355d9;
      }
      while( true ) {
        bVar1 = Lexer::takeRParen(this);
        if (bVar1) break;
        fieldtype<wasm::WATParser::ParseTypeDefsCtx>((Result<wasm::Field> *)this_00,ctx);
        std::__detail::__variant::_Copy_ctor_base<false,_wasm::Field,_wasm::Err>::_Copy_ctor_base
                  ((_Copy_ctor_base<false,_wasm::Field,_wasm::Err> *)local_60,
                   (_Copy_ctor_base<false,_wasm::Field,_wasm::Err> *)this_00);
        if (_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
            super__Move_assign_alias<wasm::Field,_wasm::Err>.
            super__Copy_assign_alias<wasm::Field,_wasm::Err>.
            super__Move_ctor_alias<wasm::Field,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
            super__Variant_storage_alias<wasm::Field,_wasm::Err>._M_u._24_1_ == '\x01') {
          std::__cxx11::string::string
                    ((string *)
                     ((long)&field.val.super__Variant_base<wasm::Field,_wasm::Err>.
                             super__Move_assign_alias<wasm::Field,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Field,_wasm::Err> + 0x20),
                     (string *)local_60);
          std::__detail::__variant::
          _Variant_storage<false,std::pair<std::vector<wasm::Name,std::allocator<wasm::Name>>,std::vector<wasm::Field,std::allocator<wasm::Field>>>,wasm::Err>
          ::_Variant_storage<1ul,wasm::Err>
                    ((_Variant_storage<false,std::pair<std::vector<wasm::Name,std::allocator<wasm::Name>>,std::vector<wasm::Field,std::allocator<wasm::Field>>>,wasm::Err>
                      *)_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
                        super__Move_assign_alias<wasm::Field,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Field,_wasm::Err>._32_8_,
                     (__index_type *)
                     ((long)&field.val.super__Variant_base<wasm::Field,_wasm::Err>.
                             super__Move_assign_alias<wasm::Field,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Field,_wasm::Err> + 0x20));
          goto LAB_00c355c7;
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Field,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Field,_wasm::Err> *)local_60);
        pbVar2 = (bool *)0x0;
        if (field.val.super__Variant_base<wasm::Field,_wasm::Err>.
            super__Move_assign_alias<wasm::Field,_wasm::Err>.
            super__Copy_assign_alias<wasm::Field,_wasm::Err>.
            super__Move_ctor_alias<wasm::Field,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
            super__Variant_storage_alias<wasm::Field,_wasm::Err>._M_u._24_1_ == '\0') {
          pbVar2 = this_00;
        }
        field_01._8_8_ = *(undefined8 *)(pbVar2 + 8);
        field_01.type.id =
             id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Name>._16_8_;
        TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::appendField
                  (&ctx->super_TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>,
                   (FieldsT *)auStack_118,(Name)ZEXT816(0),field_01);
        std::__detail::__variant::_Variant_storage<false,_wasm::Field,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Field,_wasm::Err> *)this_00);
      }
    }
    else {
      fieldtype<wasm::WATParser::ParseTypeDefsCtx>((Result<wasm::Field> *)this_00,ctx);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Field,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::Field,_wasm::Err> *)local_60,
                 (_Copy_ctor_base<false,_wasm::Field,_wasm::Err> *)this_00);
      if (_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
          super__Move_assign_alias<wasm::Field,_wasm::Err>.
          super__Copy_assign_alias<wasm::Field,_wasm::Err>.
          super__Move_ctor_alias<wasm::Field,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
          super__Variant_storage_alias<wasm::Field,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string
                  ((string *)
                   ((long)&field.val.super__Variant_base<wasm::Field,_wasm::Err>.
                           super__Move_assign_alias<wasm::Field,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Field,_wasm::Err> + 0x20),(string *)local_60
                  );
        std::__detail::__variant::
        _Variant_storage<false,std::pair<std::vector<wasm::Name,std::allocator<wasm::Name>>,std::vector<wasm::Field,std::allocator<wasm::Field>>>,wasm::Err>
        ::_Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,std::pair<std::vector<wasm::Name,std::allocator<wasm::Name>>,std::vector<wasm::Field,std::allocator<wasm::Field>>>,wasm::Err>
                    *)_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
                      super__Move_assign_alias<wasm::Field,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Field,_wasm::Err>._32_8_,
                   (__index_type *)
                   ((long)&field.val.super__Variant_base<wasm::Field,_wasm::Err>.
                           super__Move_assign_alias<wasm::Field,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Field,_wasm::Err> + 0x20));
LAB_00c355c7:
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&field.val.super__Variant_base<wasm::Field,_wasm::Err>.
                           super__Move_assign_alias<wasm::Field,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Field,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,_wasm::Field,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Field,_wasm::Err> *)local_60);
LAB_00c355d9:
        std::__detail::__variant::_Variant_storage<false,_wasm::Field,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Field,_wasm::Err> *)
                   &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_engaged);
        goto LAB_00c355f7;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Field,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Field,_wasm::Err> *)local_60);
      pbVar2 = (bool *)0x0;
      if (field.val.super__Variant_base<wasm::Field,_wasm::Err>.
          super__Move_assign_alias<wasm::Field,_wasm::Err>.
          super__Copy_assign_alias<wasm::Field,_wasm::Err>.
          super__Move_ctor_alias<wasm::Field,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
          super__Variant_storage_alias<wasm::Field,_wasm::Err>._M_u._24_1_ == '\0') {
        pbVar2 = this_00;
      }
      field_02._8_8_ = *(undefined8 *)(pbVar2 + 8);
      field_02.type.id =
           id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Name>._16_8_;
      TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::appendField
                (&ctx->super_TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>,(FieldsT *)auStack_118
                 ,(Name)ZEXT816(0),field_02);
LAB_00c355a0:
      std::__detail::__variant::_Variant_storage<false,_wasm::Field,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Field,_wasm::Err> *)this_00);
    }
  }
  std::__detail::__variant::
  _Variant_storage<false,std::pair<std::vector<wasm::Name,std::allocator<wasm::Name>>,std::vector<wasm::Field,std::allocator<wasm::Field>>>,wasm::Err>
  ::
  _Variant_storage<0ul,std::pair<std::vector<wasm::Name,std::allocator<wasm::Name>>,std::vector<wasm::Field,std::allocator<wasm::Field>>>>
            ((_Variant_storage<false,std::pair<std::vector<wasm::Name,std::allocator<wasm::Name>>,std::vector<wasm::Field,std::allocator<wasm::Field>>>,wasm::Err>
              *)_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
                super__Move_assign_alias<wasm::Field,_wasm::Err>.
                super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
                super__Variant_storage_alias<wasm::Field,_wasm::Err>._32_8_,auStack_118);
LAB_00c355f7:
  std::
  pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
  ::~pair((pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
           *)auStack_118);
  return (Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
          *)_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
            super__Move_assign_alias<wasm::Field,_wasm::Err>.
            super__Copy_assign_alias<wasm::Field,_wasm::Err>.
            super__Move_ctor_alias<wasm::Field,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
            super__Variant_storage_alias<wasm::Field,_wasm::Err>._32_8_;
}

Assistant:

Result<typename Ctx::FieldsT> fields(Ctx& ctx) {
  auto res = ctx.makeFields();
  while (true) {
    if (ctx.in.empty() || ctx.in.peekRParen()) {
      return res;
    }
    if (ctx.in.takeSExprStart("field")) {
      if (auto id = ctx.in.takeID()) {
        auto field = fieldtype(ctx);
        CHECK_ERR(field);
        if (!ctx.in.takeRParen()) {
          return ctx.in.err("expected end of field");
        }
        ctx.appendField(res, *id, *field);
      } else {
        while (!ctx.in.takeRParen()) {
          auto field = fieldtype(ctx);
          CHECK_ERR(field);
          ctx.appendField(res, {}, *field);
        }
      }
    } else {
      auto field = fieldtype(ctx);
      CHECK_ERR(field);
      ctx.appendField(res, {}, *field);
    }
  }
}